

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O0

bool __thiscall
MetricsDiscovery::MDHelper::FindMetricSetForDevice
          (MDHelper *this,IMetricsDeviceLatest *pMetricsDevice,string *metricSetSymbolName)

{
  bool bVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  TMetricSetParamsLatest *pSetParams;
  IMetricSetLatest *pMetricSet;
  uint32_t ms;
  TConcurrentGroupParamsLatest *pGroupParams;
  IConcurrentGroupLatest *pGroup;
  uint32_t cg;
  bool found;
  TMetricsDeviceParamsLatest *pDeviceParams;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 uVar7;
  undefined1 uVar8;
  uint local_44;
  uint local_30;
  bool local_1;
  
  lVar2 = (**(code **)(*in_RSI + 0x10))();
  if (lVar2 == 0) {
    local_1 = false;
  }
  else {
    local_1 = false;
    local_30 = 0;
    while( true ) {
      uVar8 = false;
      if (local_1 == false) {
        uVar8 = local_30 < *(uint *)(lVar2 + 0xc);
      }
      if ((bool)uVar8 == false) break;
      plVar3 = (long *)(**(code **)(*in_RSI + 0x18))(in_RSI,local_30);
      lVar4 = (**(code **)(*plVar3 + 0x10))();
      if (lVar4 != 0) {
        local_44 = 0;
        while( true ) {
          uVar7 = false;
          if (local_1 == false) {
            uVar7 = local_44 < *(uint *)(lVar4 + 0x14);
          }
          if ((bool)uVar7 == false) break;
          plVar5 = (long *)(**(code **)(*plVar3 + 0x18))(plVar3,local_44);
          lVar6 = (**(code **)(*plVar5 + 0x10))();
          if ((((lVar6 != 0) && ((*(uint *)(lVar6 + 0x10) & *(uint *)(in_RDI + 0x24)) != 0)) &&
              ((*(uint *)(lVar6 + 0x14) & *(uint *)(in_RDI + 0x28)) != 0)) &&
             (bVar1 = std::operator==(in_RDI,(char *)CONCAT17(uVar8,CONCAT16(uVar7,
                                                  in_stack_ffffffffffffff98))), bVar1)) {
            local_1 = true;
            *(long **)(in_RDI + 0x48) = plVar3;
            *(long **)(in_RDI + 0x50) = plVar5;
          }
          local_44 = local_44 + 1;
        }
      }
      local_30 = local_30 + 1;
    }
  }
  return local_1;
}

Assistant:

bool MDHelper::FindMetricSetForDevice(
    IMetricsDeviceLatest* pMetricsDevice,
    const std::string& metricSetSymbolName )
{
    DebugPrint("Looking for MetricSet: %s, API: %X, Category: %X\n",
        metricSetSymbolName.c_str(),
        m_APIMask,
        m_CategoryMask );

    TMetricsDeviceParamsLatest* pDeviceParams = pMetricsDevice->GetParams();
    if (NULL == pDeviceParams)
    {
        DebugPrint("MetricsDevice->GetParams returned NULL\n");
        return false;
    }

    bool found = false;
    for( uint32_t cg = 0; !found && cg < pDeviceParams->ConcurrentGroupsCount; cg++ )
    {
        IConcurrentGroupLatest *pGroup = pMetricsDevice->GetConcurrentGroup(cg);
        TConcurrentGroupParamsLatest* pGroupParams = pGroup->GetParams();

        if (NULL == pGroupParams)
        {
            continue;
        }

        for( uint32_t ms = 0; !found && ms < pGroupParams->MetricSetsCount; ms++)
        {
            IMetricSetLatest* pMetricSet = pGroup->GetMetricSet(ms);
            TMetricSetParamsLatest* pSetParams = pMetricSet->GetParams();

            if( pSetParams &&
                ( pSetParams->ApiMask & m_APIMask ) &&
                ( pSetParams->CategoryMask & m_CategoryMask ) &&
                ( metricSetSymbolName == pSetParams->SymbolName ) )
            {
                DebugPrint("Matched Group: %s MetricSet: %s MetricCount: %d API: %X, Category: %X\n",
                    pGroupParams->SymbolName,
                    pSetParams->SymbolName,
                    pSetParams->MetricsCount,
                    pSetParams->ApiMask,
                    pSetParams->CategoryMask );

                found = true;
                m_ConcurrentGroup = pGroup;
                m_MetricSet = pMetricSet;
            }
            else if( pSetParams )
            {
                DebugPrint("Skipped Group: %s MetricSet: %s MetricCount: %d API: %X, Category: %X\n",
                    pGroupParams->SymbolName,
                    pSetParams->SymbolName,
                    pSetParams->MetricsCount,
                    pSetParams->ApiMask,
                    pSetParams->CategoryMask );
            }
        }
    }

    if (m_MetricSet == NULL)
    {
        DebugPrint("MetricSet not found.\n");
    }

    return found;
}